

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

IterateResult __thiscall VertexAttrib64Bit::GetVertexAttribTest::iterate(GetVertexAttribTest *this)

{
  IterateResult IVar1;
  GLuint local_18;
  bool local_11;
  GLint i;
  bool result;
  GetVertexAttribTest *this_local;
  
  _i = this;
  Base::IterateStart(&this->super_Base);
  local_11 = true;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  initTest(this);
  for (local_18 = 1; (int)local_18 < this->m_max_vertex_attribs; local_18 = local_18 + 1) {
    checkVertexAttribLd<1u>(this,local_18,&local_11);
    checkVertexAttribLd<2u>(this,local_18,&local_11);
    checkVertexAttribLd<3u>(this,local_18,&local_11);
    checkVertexAttribLd<4u>(this,local_18,&local_11);
    checkVertexAttribLdv<1u>(this,local_18,&local_11);
    checkVertexAttribLdv<2u>(this,local_18,&local_11);
    checkVertexAttribLdv<3u>(this,local_18,&local_11);
    checkVertexAttribLdv<4u>(this,local_18,&local_11);
    checkVertexAttribLPointer(this,local_18,&local_11);
  }
  IVar1 = Base::IterateStop(&this->super_Base,(bool)(local_11 & 1));
  return IVar1;
}

Assistant:

tcu::TestNode::IterateResult GetVertexAttribTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	initTest();

	for (GLint i = 1; i < m_max_vertex_attribs; ++i)
	{
		checkVertexAttribLd<1>(i, result);
		checkVertexAttribLd<2>(i, result);
		checkVertexAttribLd<3>(i, result);
		checkVertexAttribLd<4>(i, result);
		checkVertexAttribLdv<1>(i, result);
		checkVertexAttribLdv<2>(i, result);
		checkVertexAttribLdv<3>(i, result);
		checkVertexAttribLdv<4>(i, result);
		checkVertexAttribLPointer(i, result);
	}

	/* Done */
	return IterateStop(result);
}